

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O3

void __thiscall
TEST_MockPlugin_preTestActionWillEnableMultipleComparatorsToTheGlobalMockSupportSpace_Test::testBody
          (TEST_MockPlugin_preTestActionWillEnableMultipleComparatorsToTheGlobalMockSupportSpace_Test
           *this)

{
  MockSupportPlugin *this_00;
  size_t sVar1;
  int iVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  DummyComparator comparator;
  DummyComparator comparator2;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48;
  SimpleString local_38;
  MockNamedValueComparator local_28;
  MockNamedValueComparator local_20;
  
  local_28._vptr_MockNamedValueComparator = (_func_int **)&PTR__MockNamedValueComparator_002cb0f0;
  local_20._vptr_MockNamedValueComparator = (_func_int **)&PTR__MockNamedValueComparator_002cb0f0;
  SimpleString::SimpleString(&local_68,"myType");
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin;
  MockSupportPlugin::installComparator(this_00,&local_68,&local_28);
  SimpleString::~SimpleString(&local_68);
  SimpleString::SimpleString(&local_68,"myOtherType");
  MockSupportPlugin::installComparator(this_00,&local_68,&local_20);
  SimpleString::~SimpleString(&local_68);
  MockSupportPlugin::preTestAction
            (this_00,(this->super_TEST_GROUP_CppUTestGroupMockPlugin).test,
             (this->super_TEST_GROUP_CppUTestGroupMockPlugin).result);
  SimpleString::SimpleString(&local_68,"");
  pMVar3 = mock(&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_38,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_38);
  SimpleString::SimpleString(&local_48,"myType");
  SimpleString::SimpleString(&local_58,"name");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x28))
            ((long *)CONCAT44(extraout_var,iVar2),&local_48,&local_58,&local_28);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_68);
  SimpleString::SimpleString(&local_68,"");
  pMVar3 = mock(&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_38,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_38);
  SimpleString::SimpleString(&local_48,"myOtherType");
  SimpleString::SimpleString(&local_58,"name");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x28))
            ((long *)CONCAT44(extraout_var_00,iVar2),&local_48,&local_58,&local_28);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_68);
  SimpleString::SimpleString(&local_68,"");
  pMVar3 = mock(&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_38,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_38);
  SimpleString::SimpleString(&local_48,"myType");
  SimpleString::SimpleString(&local_58,"name");
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x20))
            ((long *)CONCAT44(extraout_var_01,iVar2),&local_48,&local_58,&local_28);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_68);
  SimpleString::SimpleString(&local_68,"");
  pMVar3 = mock(&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_38,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_38);
  SimpleString::SimpleString(&local_48,"myOtherType");
  SimpleString::SimpleString(&local_58,"name");
  (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x20))
            ((long *)CONCAT44(extraout_var_02,iVar2),&local_48,&local_58,&local_28);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_68);
  SimpleString::SimpleString(&local_68,"");
  pMVar3 = mock(&local_68,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x25])(pMVar3);
  SimpleString::~SimpleString(&local_68);
  pUVar4 = UtestShell::getCurrent();
  sVar1 = ((this->super_TEST_GROUP_CppUTestGroupMockPlugin).result)->failureCount_;
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,0,sVar1,"LONGS_EQUAL(0, result->getFailureCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockPluginTest.cpp"
             ,0x9e,pTVar5);
  MockSupportPlugin::clear(this_00);
  return;
}

Assistant:

TEST(MockPlugin, preTestActionWillEnableMultipleComparatorsToTheGlobalMockSupportSpace)
{
    DummyComparator comparator;
    DummyComparator comparator2;
    plugin.installComparator("myType", comparator);
    plugin.installComparator("myOtherType", comparator2);

    plugin.preTestAction(*test, *result);
    mock().expectOneCall("foo").withParameterOfType("myType", "name", &comparator);
    mock().expectOneCall("foo").withParameterOfType("myOtherType", "name", &comparator);
    mock().actualCall("foo").withParameterOfType("myType", "name", &comparator);
    mock().actualCall("foo").withParameterOfType("myOtherType", "name", &comparator);

    mock().checkExpectations();
    LONGS_EQUAL(0, result->getFailureCount());

    plugin.clear();
}